

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall pugi::impl::anon_unknown_0::xpath_ast_node::is_posinv_step(xpath_ast_node *this)

{
  xpath_ast_node *pxVar1;
  bool bVar2;
  
  if (this->_type != '8') {
    __assert_fail("_type == ast_step",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0x2c59,
                  "bool pugi::impl::(anonymous namespace)::xpath_ast_node::is_posinv_step() const");
  }
  pxVar1 = this->_right;
  while( true ) {
    bVar2 = pxVar1 == (xpath_ast_node *)0x0;
    if (bVar2) {
      return bVar2;
    }
    if (pxVar1->_type != '\x10') break;
    if (pxVar1->_test != '\x01') {
      return bVar2;
    }
    pxVar1 = pxVar1->_next;
  }
  __assert_fail("n->_type == ast_predicate",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                ,0x2c5d,
                "bool pugi::impl::(anonymous namespace)::xpath_ast_node::is_posinv_step() const");
}

Assistant:

bool is_posinv_step() const
		{
			assert(_type == ast_step);

			for (xpath_ast_node* n = _right; n; n = n->_next)
			{
				assert(n->_type == ast_predicate);

				if (n->_test != predicate_posinv)
					return false;
			}

			return true;
		}